

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSU_TEST.cpp
# Opt level: O1

void __thiscall
Valid_test_case_DSU_DSU_unit_test_Test::TestBody(Valid_test_case_DSU_DSU_unit_test_Test *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *in_R9;
  AssertionResult gtest_ar_;
  DSU dsu;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  DSU local_40;
  string local_28;
  
  DSU::DSU(&local_40);
  iVar1 = 1;
  do {
    iVar3 = iVar1;
    iVar1 = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3];
  } while (iVar3 != local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3]);
  iVar1 = 2;
  do {
    iVar4 = iVar1;
    iVar1 = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4];
  } while (iVar4 != local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar4]);
  if ((iVar3 != -1) && (iVar4 != -1)) {
    local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar4] = iVar3;
  }
  iVar1 = 3;
  do {
    iVar3 = iVar1;
    iVar1 = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3];
  } while (iVar3 != local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3]);
  iVar1 = 4;
  do {
    iVar4 = iVar1;
    iVar1 = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4];
  } while (iVar4 != local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar4]);
  if ((iVar3 != -1) && (iVar4 != -1)) {
    local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar4] = iVar3;
  }
  iVar1 = 5;
  do {
    iVar3 = iVar1;
    iVar1 = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3];
  } while (iVar3 != local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3]);
  iVar1 = 6;
  do {
    iVar4 = iVar1;
    iVar1 = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4];
  } while (iVar4 != local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar4]);
  if ((iVar3 != -1) && (iVar4 != -1)) {
    local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar4] = iVar3;
  }
  iVar1 = 1;
  do {
    iVar3 = iVar1;
    iVar1 = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3];
  } while (iVar3 != local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3]);
  iVar1 = 4;
  do {
    iVar4 = iVar1;
    iVar1 = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4];
  } while (iVar4 != local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar4]);
  if ((iVar3 != -1) && (iVar4 != -1)) {
    local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar4] = iVar3;
  }
  iVar1 = 4;
  do {
    iVar3 = iVar1;
    iVar1 = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar3];
  } while (iVar3 != local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar3]);
  iVar1 = 1;
  do {
    iVar4 = iVar1;
    iVar1 = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4];
  } while (iVar4 != local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar4]);
  local_50[0] = (internal)(iVar3 == iVar4);
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_50[0]) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_28,local_50,(AssertionResult *)"dsu.find(4) == dsu.find(1)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Data structures/Disjoint-set-union/DSU_TEST.cpp"
               ,0x10,local_28._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p);
    }
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.par.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Valid_test_case_DSU, DSU_unit_test){
    DSU dsu;
    dsu.unionSet(1, 2);
    dsu.unionSet(3, 4);
    dsu.unionSet(5, 6);
    dsu.unionSet(1, 4);

    ASSERT_TRUE(dsu.find(4) == dsu.find(1));
}